

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O1

double __thiscall
despot::BaseRockSample::StepReward(BaseRockSample *this,Belief *belief,ACT_TYPE action)

{
  double dVar1;
  long *plVar2;
  long lVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  
  plVar2 = (long *)(**(code **)(*(long *)belief + 0x30))(belief);
  lVar3 = *plVar2;
  if (plVar2[1] == lVar3) {
    dVar6 = 0.0;
  }
  else {
    dVar6 = 0.0;
    uVar4 = 0;
    do {
      lVar3 = *(long *)(lVar3 + uVar4 * 8);
      dVar1 = *(double *)(lVar3 + 0x18);
      dVar5 = (double)(**(code **)(*(long *)this + 0x28))(this,*(undefined4 *)(lVar3 + 0xc),action);
      dVar6 = dVar6 + dVar5 * dVar1;
      uVar4 = uVar4 + 1;
      lVar3 = *plVar2;
    } while (uVar4 < (ulong)(plVar2[1] - lVar3 >> 3));
  }
  return dVar6;
}

Assistant:

double BaseRockSample::StepReward(const Belief* belief, ACT_TYPE action) const {
	const vector<State*>& particles =
		static_cast<const ParticleBelief*>(belief)->particles();

	double value = 0;
	for (int i = 0; i < particles.size(); i++) {
		State* particle = particles[i];
		value += particle->weight * Reward(particle->state_id, action);
	}

	return value;
}